

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_0::ValidateUint32ConstantOperandForDebugInfo
          (ValidationState_t *_,string *operand_name,Instruction *inst,uint32_t word_index,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
          *ext_inst_name)

{
  bool bVar1;
  uint32_t id;
  DiagnosticStream *pDVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  DiagnosticStream local_210;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  *local_38;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  *ext_inst_name_local;
  Instruction *pIStack_28;
  uint32_t word_index_local;
  Instruction *inst_local;
  string *operand_name_local;
  ValidationState_t *__local;
  
  local_38 = ext_inst_name;
  ext_inst_name_local._4_4_ = word_index;
  pIStack_28 = inst;
  inst_local = (Instruction *)operand_name;
  operand_name_local = (string *)_;
  id = Instruction::word(inst,(ulong)word_index);
  bVar1 = IsUint32Constant(_,id);
  if (bVar1) {
    __local._4_4_ = SPV_SUCCESS;
  }
  else {
    ValidationState_t::diag
              (&local_210,(ValidationState_t *)operand_name_local,SPV_ERROR_INVALID_DATA,pIStack_28)
    ;
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    operator()(&local_230,local_38);
    pDVar2 = DiagnosticStream::operator<<(&local_210,&local_230);
    pDVar2 = DiagnosticStream::operator<<(pDVar2,(char (*) [20])": expected operand ");
    pDVar2 = DiagnosticStream::operator<<
                       (pDVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               inst_local);
    pDVar2 = DiagnosticStream::operator<<
                       (pDVar2,(char (*) [51])" must be a result id of 32-bit unsigned OpConstant");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar2);
    std::__cxx11::string::~string((string *)&local_230);
    DiagnosticStream::~DiagnosticStream(&local_210);
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateUint32ConstantOperandForDebugInfo(
    ValidationState_t& _, const std::string& operand_name,
    const Instruction* inst, uint32_t word_index,
    const std::function<std::string()>& ext_inst_name) {
  if (!IsUint32Constant(_, inst->word(word_index))) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << ext_inst_name() << ": expected operand " << operand_name
           << " must be a result id of 32-bit unsigned OpConstant";
  }
  return SPV_SUCCESS;
}